

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes(Aig_Man_t *pAig,int nFans)

{
  Vec_Ptr_t *p;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *p_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vNodes;
  int nFans_local;
  Aig_Man_t *pAig_local;
  
  Aig_ManCleanMarkA(pAig);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_2c);
    if (((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) &&
       (iVar1 = Aig_ObjRefs(pAVar2), nFans <= iVar1)) {
      *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
    }
  }
  for (local_2c = 0; iVar1 = Saig_ManRegNum(pAig), local_2c < iVar1; local_2c = local_2c + 1) {
    p = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p,local_2c + iVar1);
    pAVar2 = Aig_ObjFanin0(pAVar2);
    *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef;
  }
  p_00 = Vec_IntAlloc(100);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_2c);
    if (((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) &&
       ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0)) {
      iVar1 = Aig_ObjId(pAVar2);
      Vec_IntPush(p_00,iVar1);
    }
  }
  Aig_ManCleanMarkA(pAig);
  return p_00;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes( Aig_Man_t * pAig, int nFans )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanMarkA( pAig );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjRefs(pObj) >= nFans )
            pObj->fMarkA = 1;
    // unmark flop drivers
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjFanin0(pObj)->fMarkA = 0;
    // collect mapping
    vNodes = Vec_IntAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntPush( vNodes, Aig_ObjId(pObj) );
    Aig_ManCleanMarkA( pAig );
    return vNodes;
}